

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

CURLcode submit_CONNECT(Curl_cfilter *cf,Curl_easy *data,tunnel_stream *ts)

{
  uint uVar1;
  tunnel_stream *data_00;
  Curl_easy *cf_00;
  char *pcVar2;
  httpreq *local_38;
  httpreq *req;
  undefined8 *puStack_28;
  CURLcode result;
  cf_h2_proxy_ctx *ctx;
  tunnel_stream *ts_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puStack_28 = (undefined8 *)cf->ctx;
  local_38 = (httpreq *)0x0;
  ctx = (cf_h2_proxy_ctx *)ts;
  ts_local = (tunnel_stream *)data;
  data_local = (Curl_easy *)cf;
  req._4_4_ = Curl_http_proxy_create_CONNECT(&local_38,cf,data,2);
  if (req._4_4_ == CURLE_OK) {
    if ((ts_local != (tunnel_stream *)0x0) &&
       ((*(ulong *)((long)&ts_local[0xf].sendbuf.chunk_size + 2) >> 0x1c & 1) != 0)) {
      Curl_infof((Curl_easy *)ts_local,"Establish HTTP/2 proxy tunnel to %s",local_38->authority);
    }
    req._4_4_ = proxy_h2_submit((int32_t *)&ctx->tunnel,(Curl_cfilter *)data_local,
                                (Curl_easy *)ts_local,(nghttp2_session *)*puStack_28,local_38,
                                (nghttp2_priority_spec *)0x0,ctx,tunnel_send_callback,data_local);
    cf_00 = data_local;
    data_00 = ts_local;
    if ((((req._4_4_ != CURLE_OK) && (ts_local != (tunnel_stream *)0x0)) &&
        ((*(ulong *)((long)&ts_local[0xf].sendbuf.chunk_size + 2) >> 0x1c & 1) != 0)) &&
       ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      uVar1 = *(uint *)&(ctx->tunnel).resp;
      pcVar2 = nghttp2_strerror(*(int *)&(ctx->tunnel).resp);
      Curl_trc_cf_infof((Curl_easy *)data_00,(Curl_cfilter *)cf_00,
                        "[%d] send, nghttp2_submit_request error: %s",(ulong)uVar1,pcVar2);
    }
  }
  if (local_38 != (httpreq *)0x0) {
    Curl_http_req_free(local_38);
  }
  if (req._4_4_ != CURLE_OK) {
    Curl_failf((Curl_easy *)ts_local,"Failed sending CONNECT to proxy");
  }
  return req._4_4_;
}

Assistant:

static CURLcode submit_CONNECT(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               struct tunnel_stream *ts)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  CURLcode result;
  struct httpreq *req = NULL;

  result = Curl_http_proxy_create_CONNECT(&req, cf, data, 2);
  if(result)
    goto out;

  infof(data, "Establish HTTP/2 proxy tunnel to %s", req->authority);

  result = proxy_h2_submit(&ts->stream_id, cf, data, ctx->h2, req,
                           NULL, ts, tunnel_send_callback, cf);
  if(result) {
    CURL_TRC_CF(data, cf, "[%d] send, nghttp2_submit_request error: %s",
                ts->stream_id, nghttp2_strerror(ts->stream_id));
  }

out:
  if(req)
    Curl_http_req_free(req);
  if(result)
    failf(data, "Failed sending CONNECT to proxy");
  return result;
}